

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O3

void __thiscall cmNinjaNormalTargetGenerator::Generate(cmNinjaNormalTargetGenerator *this)

{
  TargetType TVar1;
  string *psVar2;
  
  if ((this->TargetLinkLanguage)._M_string_length == 0) {
    psVar2 = cmGeneratorTarget::GetName_abi_cxx11_
                       ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                        GeneratorTarget);
    cmSystemTools::Error
              ("CMake can not determine linker language for target: ",(psVar2->_M_dataplus)._M_p,
               (char *)0x0,(char *)0x0);
    return;
  }
  WriteLanguagesRules(this);
  cmNinjaTargetGenerator::WriteObjectBuildStatements(&this->super_cmNinjaTargetGenerator);
  TVar1 = cmGeneratorTarget::GetType
                    ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                     GeneratorTarget);
  if (TVar1 == OBJECT_LIBRARY) {
    WriteObjectLibStatement(this);
    return;
  }
  WriteDeviceLinkStatement(this);
  WriteLinkStatement(this);
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::Generate()
{
  if (this->TargetLinkLanguage.empty()) {
    cmSystemTools::Error("CMake can not determine linker language for "
                         "target: ",
                         this->GetGeneratorTarget()->GetName().c_str());
    return;
  }

  // Write the rules for each language.
  this->WriteLanguagesRules();

  // Write the build statements
  this->WriteObjectBuildStatements();

  if (this->GetGeneratorTarget()->GetType() == cmStateEnums::OBJECT_LIBRARY) {
    this->WriteObjectLibStatement();
  } else {
    // If this target has cuda language link inputs, and we need to do
    // device linking
    this->WriteDeviceLinkStatement();
    this->WriteLinkStatement();
  }
}